

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O2

int big2_entityValueTok(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  char cVar1;
  long lVar2;
  int iVar3;
  byte *pbVar4;
  char *pcVar5;
  long lVar6;
  
  if (ptr == end) {
    iVar3 = -4;
  }
  else {
    lVar2 = 2;
    for (pbVar4 = (byte *)ptr; pbVar4 != (byte *)end; pbVar4 = pbVar4 + lVar6) {
      if (*pbVar4 - 0xd8 < 4) {
switchD_0015a95d_caseD_7:
        lVar6 = 4;
      }
      else {
        lVar6 = lVar2;
        if (*pbVar4 == 0) {
          cVar1 = *(char *)((long)enc[1].scanners + (ulong)pbVar4[1]);
          switch(cVar1) {
          case '\x03':
            if (pbVar4 == (byte *)ptr) {
              iVar3 = big2_scanRef(enc,ptr + 2,end,nextTokPtr);
              return iVar3;
            }
            goto LAB_0015a9cd;
          case '\x04':
          case '\x05':
          case '\b':
            break;
          case '\x06':
            lVar6 = 3;
            break;
          case '\a':
            goto switchD_0015a95d_caseD_7;
          case '\t':
            if (pbVar4 == (byte *)ptr) {
              pcVar5 = ptr + 2;
              if (pcVar5 != end) {
                if ((*pcVar5 == '\0') &&
                   (*(char *)((long)enc[1].scanners + (ulong)(byte)ptr[3]) == '\n')) {
                  pcVar5 = ptr + 4;
                }
                *nextTokPtr = pcVar5;
                return 7;
              }
              return -3;
            }
            goto LAB_0015a9cd;
          case '\n':
            if (pbVar4 == (byte *)ptr) {
              *nextTokPtr = ptr + 2;
              return 7;
            }
            goto LAB_0015a9cd;
          default:
            if (cVar1 == '\x1e') {
              if (pbVar4 == (byte *)ptr) {
                iVar3 = big2_scanPercent(enc,ptr + 2,end,nextTokPtr);
                if (iVar3 != 0x16) {
                  return iVar3;
                }
                return 0;
              }
              goto LAB_0015a9cd;
            }
          }
        }
      }
    }
LAB_0015a9cd:
    *nextTokPtr = (char *)pbVar4;
    iVar3 = 6;
  }
  return iVar3;
}

Assistant:

static
int PREFIX(entityValueTok)(const ENCODING *enc, const char *ptr, const char *end,
                           const char **nextTokPtr)
{
  const char *start;
  if (ptr == end)
    return XML_TOK_NONE;
  start = ptr;
  while (ptr != end) {
    switch (BYTE_TYPE(enc, ptr)) {
#define LEAD_CASE(n) \
    case BT_LEAD ## n: ptr += n; break;
    LEAD_CASE(2) LEAD_CASE(3) LEAD_CASE(4)
#undef LEAD_CASE
    case BT_AMP:
      if (ptr == start)
        return PREFIX(scanRef)(enc, ptr + MINBPC(enc), end, nextTokPtr);
      *nextTokPtr = ptr;
      return XML_TOK_DATA_CHARS;
    case BT_PERCNT:
      if (ptr == start) {
        int tok =  PREFIX(scanPercent)(enc, ptr + MINBPC(enc),
                                       end, nextTokPtr);
        return (tok == XML_TOK_PERCENT) ? XML_TOK_INVALID : tok;
      }
      *nextTokPtr = ptr;
      return XML_TOK_DATA_CHARS;
    case BT_LF:
      if (ptr == start) {
        *nextTokPtr = ptr + MINBPC(enc);
        return XML_TOK_DATA_NEWLINE;
      }
      *nextTokPtr = ptr;
      return XML_TOK_DATA_CHARS;
    case BT_CR:
      if (ptr == start) {
        ptr += MINBPC(enc);
        if (ptr == end)
          return XML_TOK_TRAILING_CR;
        if (BYTE_TYPE(enc, ptr) == BT_LF)
          ptr += MINBPC(enc);
        *nextTokPtr = ptr;
        return XML_TOK_DATA_NEWLINE;
      }
      *nextTokPtr = ptr;
      return XML_TOK_DATA_CHARS;
    default:
      ptr += MINBPC(enc);
      break;
    }
  }
  *nextTokPtr = ptr;
  return XML_TOK_DATA_CHARS;
}